

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.test.cpp
# Opt level: O2

ostream * operator<<(ostream *out,
                    FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *map)

{
  pointer ppVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *v;
  pointer ppVar5;
  bool bVar6;
  
  std::operator<<(out,"{ ");
  ppVar1 = (map->vec_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = 0;
  for (ppVar5 = (map->vec_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar1; ppVar5 = ppVar5 + 1) {
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + -1;
    pcVar4 = ", ";
    if (bVar6) {
      pcVar4 = "";
    }
    poVar2 = std::operator<<(out,pcVar4);
    poVar2 = std::operator<<(poVar2,"[");
    poVar2 = std::operator<<(poVar2,(string *)ppVar5);
    poVar2 = std::operator<<(poVar2,"] -> ");
    std::ostream::operator<<(poVar2,ppVar5->second);
  }
  poVar2 = std::operator<<(out," }");
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const FlatMap<Key, Value, Compare>& map) {
    out << "{ ";
    size_t i = 0;
    for (const auto& v : map) {
        out << (i++ == 0 ? "" : ", ") << "[" << v.first << "] -> " << v.second;
    }
    return out << " }";
}